

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O0

int __thiscall
QDateTimeParser::findMonth
          (QDateTimeParser *this,QStringView str,int startMonth,int sectionIndex,int year,
          QString *usedMonth,int *used)

{
  long lVar1;
  uint month_00;
  SectionNode *locale;
  int in_ECX;
  ShortVector<QString> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  int index;
  int month;
  FormatType type;
  SectionNode *sn;
  QLocale l;
  ShortVector<QString> monthNames;
  QString *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  QMessageLogger *in_stack_fffffffffffffdf0;
  QVarLengthArray<QString,_13LL> *this_00;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  int local_1f8;
  FormatType in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe28;
  int iVar2;
  ShortVector<QString> *entries;
  int local_1bc;
  QStringView in_stack_fffffffffffffe60;
  undefined1 *local_190;
  QMessageLogger local_188;
  QMessageLogger local_158;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  entries = in_RDI;
  locale = sectionNode((QDateTimeParser *)
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (int)((ulong)in_RDI >> 0x20));
  if (locale->type == MonthSection) {
    month_00 = (uint)(locale->count == 3);
    local_190 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)((in_RDI->super_QVLABase<QString>).super_QVLABaseBase.a + 0x30))(&local_190);
    this_00 = (QVarLengthArray<QString,_13LL> *)&local_158;
    memset(this_00,0xaa,0x150);
    QVarLengthArray<QString,_13LL>::QVarLengthArray(this_00);
    local_1f8 = in_ECX;
    QVarLengthArray<QString,_13LL>::reserve
              (this_00,CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    iVar2 = local_1f8;
    for (; local_1f8 < 0xd; local_1f8 = local_1f8 + 1) {
      QCalendar::monthName
                ((QCalendar *)CONCAT44(in_R9D,in_stack_fffffffffffffe28),(QLocale *)locale,month_00,
                 in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
      QVarLengthArray<QString,_13LL>::append
                ((QVarLengthArray<QString,_13LL> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 in_stack_fffffffffffffdd8);
      QString::~QString((QString *)0x76e1f1);
    }
    local_1bc = findTextEntry(in_stack_fffffffffffffe60,entries,(QString *)CONCAT44(iVar2,in_R8D),
                              (int *)CONCAT44(in_R9D,in_stack_fffffffffffffe28));
    if (-1 < local_1bc) {
      local_1bc = local_1bc + iVar2;
    }
    QVarLengthArray<QString,_13LL>::~QVarLengthArray(this_00);
    QLocale::~QLocale((QLocale *)0x76e2ba);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde4,(char *)in_stack_fffffffffffffdd8);
    QMessageLogger::warning(&local_188,"QDateTimeParser::findMonth Internal error");
    local_1bc = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1bc;
}

Assistant:

int QDateTimeParser::findMonth(QStringView str, int startMonth, int sectionIndex,
                               int year, QString *usedMonth, int *used) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    if (sn.type != MonthSection) {
        qWarning("QDateTimeParser::findMonth Internal error");
        return -1;
    }

    QLocale::FormatType type = sn.count == 3 ? QLocale::ShortFormat : QLocale::LongFormat;
    QLocale l = locale();
    ShortVector<QString> monthNames;
    monthNames.reserve(13 - startMonth);
    for (int month = startMonth; month <= 12; ++month)
        monthNames.append(calendar.monthName(l, month, year, type));

    const int index = findTextEntry(str, monthNames, usedMonth, used);
    return index < 0 ? index : index + startMonth;
}